

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  byte *pbVar1;
  uint *puVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  int *piVar4;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  CURLcode CVar8;
  uint uVar9;
  imapstate iVar10;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  SessionHandle *pSVar14;
  size_t __n;
  size_t sVar15;
  size_t maxlen;
  pop3_conn *pop3c;
  saslprogress local_50;
  undefined4 uStack_4c;
  int pop3code;
  SASL *local_40;
  size_t nread;
  
  sockfd = conn->sock[0];
  nread = 0;
  CVar6 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar6 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar6;
    }
    local_40 = (SASL *)&(conn->proto).imapc.sasl.prefmech;
    do {
      CVar6 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&pop3code,&nread);
      iVar7 = pop3code;
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (pop3code == 0) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        pSVar14 = conn->data;
        sVar11 = strlen((pSVar14->state).buffer);
        if (iVar7 != 0x2b) {
          Curl_failf(pSVar14,"Got unexpected pop3-server response");
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        if ((3 < sVar11) && ((pSVar14->state).buffer[sVar11 - 2] == '>')) {
          __n = sVar11 - 4;
          for (lVar12 = 0x893; lVar12 - 0x890U < sVar11 - 2; lVar12 = lVar12 + 1) {
            if (*(char *)((long)pSVar14->sockets + lVar12 + -0x38) == '<') {
              if (__n != 0) {
                pcVar13 = (char *)(*Curl_ccalloc)(1,__n + 1);
                (conn->proto).imapc.mailbox_uidvalidity = pcVar13;
                if (pcVar13 != (char *)0x0) {
                  memcpy(pcVar13,(void *)((long)pSVar14->sockets + lVar12 + -0x38),__n);
                  (conn->proto).imapc.mailbox_uidvalidity[__n] = '\0';
                  pbVar1 = (byte *)((long)&conn->proto + 0xa8);
                  *pbVar1 = *pbVar1 | 2;
                }
              }
              break;
            }
            __n = __n - 1;
          }
        }
        *(undefined4 *)((long)&conn->proto + 0x94) = 0;
        (conn->proto).imapc.cmdid = 0;
        (conn->proto).pop3c.tls_supported = false;
        CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CAPA");
        iVar10 = IMAP_CAPABILITY;
        goto joined_r0x00123e92;
      case IMAP_CAPABILITY:
        pSVar14 = conn->data;
        pcVar13 = (pSVar14->state).buffer;
        sVar11 = strlen(pcVar13);
        if (iVar7 == 0x2b) {
          cVar3 = (pSVar14->set).use_ssl;
          if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).pop3c.tls_supported == true) {
              CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STLS");
              iVar10 = IMAP_STARTTLS;
              goto joined_r0x00123e92;
            }
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(pSVar14,"STLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
          goto LAB_001240df;
        }
        if (iVar7 != 0x2a) {
          pbVar1 = (byte *)((long)&conn->proto + 0xa8);
          *pbVar1 = *pbVar1 | 1;
          goto LAB_001240df;
        }
        if (3 < sVar11) {
          if (*(int *)pcVar13 == 0x534c5453) {
            (conn->proto).pop3c.tls_supported = true;
          }
          else if (*(int *)pcVar13 == 0x52455355) {
            pbVar1 = (byte *)((long)&conn->proto + 0xa8);
            *pbVar1 = *pbVar1 | 1;
          }
          else if ((sVar11 != 4) && (iVar7 = bcmp(pcVar13,"SASL ",5), iVar7 == 0)) {
            pbVar1 = (byte *)((long)&conn->proto + 0xa8);
            *pbVar1 = *pbVar1 | 4;
            pcVar13 = (pSVar14->state).buffer + 5;
            lVar12 = sVar11 - 5;
            do {
              lVar12 = -lVar12;
              while( true ) {
                if (lVar12 == 0) goto LAB_001240f3;
                if ((0x20 < (ulong)(byte)*pcVar13) ||
                   ((0x100002600U >> ((ulong)(byte)*pcVar13 & 0x3f) & 1) == 0)) break;
                pcVar13 = pcVar13 + 1;
                lVar12 = lVar12 + 1;
              }
              sVar15 = 0;
              while ((maxlen = -lVar12, lVar12 + sVar15 != 0 &&
                     ((0x20 < (ulong)(byte)pcVar13[sVar15] ||
                      (maxlen = sVar15,
                      (0x100002600U >> ((ulong)(byte)pcVar13[sVar15] & 0x3f) & 1) == 0))))) {
                sVar15 = sVar15 + 1;
              }
              uVar9 = Curl_sasl_decode_mech(pcVar13,maxlen,(size_t *)&local_50);
              if ((uVar9 != 0) && (CONCAT44(uStack_4c,local_50) == maxlen)) {
                puVar2 = (uint *)((long)&conn->proto + 0x94);
                *puVar2 = *puVar2 | uVar9;
              }
              pcVar13 = pcVar13 + maxlen;
              lVar12 = -(lVar12 + maxlen);
            } while( true );
          }
        }
        goto LAB_001240f3;
      case IMAP_STARTTLS:
        if (pop3code == 0x2b) {
          return CURLE_NOT_BUILT_IN;
        }
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)pop3code);
          return CURLE_USE_SSL_FAILED;
        }
LAB_001240df:
        CVar8 = pop3_perform_authentication(conn);
        break;
      default:
switchD_00123dcd_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      case IMAP_AUTHENTICATE:
        pSVar14 = conn->data;
        CVar8 = Curl_sasl_continue(local_40,conn,pop3code,&local_50);
        if (CVar8 == CURLE_OK) {
          if (local_50 == SASL_IDLE) {
            uVar9 = (conn->proto).pop3c.preftype & (conn->proto).pop3c.authtypes;
            if ((uVar9 & 2) == 0) {
              if ((uVar9 & 1) == 0) {
                Curl_failf(pSVar14,"Authentication cancelled");
                CVar8 = CURLE_LOGIN_DENIED;
              }
              else {
                CVar8 = pop3_perform_user(conn);
              }
            }
            else {
              CVar8 = pop3_perform_apop(conn);
            }
          }
          else {
            CVar8 = CURLE_OK;
            CVar6 = CURLE_OK;
            if (local_50 == SASL_DONE) goto LAB_0012408c;
          }
        }
        break;
      case IMAP_LOGIN:
        if (pop3code == 0x2b) goto switchD_00123dcd_caseD_4;
        pSVar14 = conn->data;
        pcVar13 = "Authentication failed: %d";
        goto LAB_00124281;
      case IMAP_LIST:
        if (pop3code != 0x2b) goto LAB_00124224;
        pcVar13 = conn->passwd;
        if (pcVar13 == (char *)0x0) {
          pcVar13 = "";
        }
        CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar13);
        iVar10 = IMAP_SELECT;
joined_r0x00123e92:
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
        (conn->proto).imapc.state = iVar10;
        goto LAB_001241c3;
      case IMAP_SELECT:
        if (pop3code == 0x2b) goto switchD_00123dcd_caseD_4;
LAB_00124224:
        pSVar14 = conn->data;
        pcVar13 = "Access denied. %c";
LAB_00124281:
        Curl_failf(pSVar14,pcVar13,(ulong)(uint)pop3code);
        return CURLE_LOGIN_DENIED;
      case IMAP_FETCH:
        CVar6 = CURLE_RECV_ERROR;
        if (pop3code == 0x2b) {
          pSVar14 = conn->data;
          piVar4 = (int *)(pSVar14->req).protop;
          (conn->proto).pop3c.eob = 2;
          (conn->proto).pop3c.strip = 2;
          CVar6 = CURLE_OK;
          if (*piVar4 == 0) {
            Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
            pcVar13 = (conn->proto).ftpc.pp.cache;
            CVar6 = CURLE_OK;
            if (pcVar13 != (char *)0x0) {
              if ((pSVar14->set).opt_no_body == false) {
                CVar6 = Curl_pop3_write(conn,pcVar13,(conn->proto).rtspc.rtp_bufsize);
                if (CVar6 != CURLE_OK) {
                  return CVar6;
                }
                pcVar13 = (pp->ftpc).pp.cache;
              }
              (*Curl_cfree)(pcVar13);
              (pp->ftpc).pp.cache = (char *)0x0;
              (conn->proto).ftpc.pp.cache_size = 0;
              CVar6 = CURLE_OK;
            }
          }
        }
LAB_0012408c:
        CVar8 = CVar6;
        (conn->proto).imapc.state = IMAP_STOP;
      }
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
LAB_001240f3:
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
LAB_001241c3:
      _Var5 = Curl_pp_moredata(&(pp->ftpc).pp);
      CVar6 = CURLE_OK;
    } while (_Var5);
  }
  return CVar6;
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}